

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O1

ParserResult *
parse_const_statement
          (ParserResult *__return_storage_ptr__,ParserContext *parser,token_iterator begin,
          token_iterator end)

{
  Token TVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t sVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  SyntaxTree *pSVar7;
  runtime_error *this;
  undefined1 auVar8 [8];
  ParserState value;
  ParserState identifier;
  token_iterator local_360;
  token_iterator local_358;
  NodeType local_350;
  ParserStatus local_34c;
  undefined1 local_348 [8];
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  _Stack_340;
  shared_ptr<SyntaxTree> local_2e8;
  shared_ptr<SyntaxTree> local_2d8;
  shared_ptr<SyntaxTree> local_2c8;
  anon_union_80_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>_3
  local_2b8;
  anon_union_80_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>_3
  local_258;
  long local_208;
  anon_union_80_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>_3
  local_1f8;
  long local_1a8;
  anon_union_80_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>_3
  local_198;
  undefined8 local_148;
  ParserState local_138;
  ParserState local_e0;
  ParserState local_88;
  
  local_360 = begin;
  if ((begin == end) || (1 < begin->type - CONST_INT)) {
    local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
    make_error<ParserStatus,TokenStream::TokenData_const*&>
              ((ParserState *)local_348,(ParserStatus *)&local_2b8._target,&local_360);
    __return_storage_ptr__->first = end;
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&__return_storage_ptr__->second,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)local_348);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                *)local_348);
  }
  else {
    local_198._0_8_ = 0;
    local_198._8_8_ = 0;
    local_148 = 1;
    local_1a8 = 0;
    local_1f8._64_8_ = 0;
    local_1f8._72_8_ = 0;
    local_1f8._48_8_ = 0;
    local_1f8._56_8_ = 0;
    local_1f8._32_8_ = 0;
    local_1f8._40_8_ = 0;
    local_1f8._16_8_ = 0;
    local_1f8._24_8_ = 0;
    local_1f8._0_8_ = 0;
    local_1f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_208 = 0;
    local_258._64_8_ = 0;
    local_258._72_8_ = 0;
    local_258._48_8_ = 0;
    local_258._56_8_ = 0;
    local_258._32_8_ = 0;
    local_258._40_8_ = 0;
    local_258._16_8_ = 0;
    local_258._24_8_ = 0;
    local_258._0_8_ = 0;
    local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    TVar1 = begin->type;
    local_350 = CONST_INT;
    if ((TVar1 != CONST_INT) && (local_350 = CONST_FLOAT, TVar1 != CONST_FLOAT)) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,
                 "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/parser_syntax.cpp(783)."
                );
      *(undefined ***)this = &PTR__runtime_error_002195e8;
      __cxa_throw(this,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
    }
    parse_identifier((ParserResult *)local_348,parser,begin + 1,end);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::operator=((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                 *)&local_1f8._tail,&_Stack_340);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy(&_Stack_340);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&local_88,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&local_1f8._tail);
    giveup_to_expected((ParserState *)local_348,&local_88,"identifier");
    add_error((ParserState *)&local_198._tail,(ParserState *)local_348);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                *)local_348);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy(&local_88._storage);
    if (TVar1 == CONST_INT) {
      local_358 = (token_iterator)local_348;
      if ((local_348 == (undefined1  [8])end) || (*(int *)local_348 != 0x13)) {
        local_34c = GiveUp;
        make_error<ParserStatus,TokenStream::TokenData_const*&>
                  ((ParserState *)&local_2b8._tail,&local_34c,&local_358);
        local_348 = (undefined1  [8])end;
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        ::_storage(&_Stack_340.
                    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                   ,(_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                     *)&local_2b8._tail);
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
        ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                    *)&local_2b8._tail);
      }
      else {
        pSVar7 = (SyntaxTree *)operator_new(0x88);
        (pSVar7->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
        super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        (pSVar7->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
        super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pSVar7->type_ = Integer;
        sVar3 = *(size_t *)((long)local_348 + 8);
        *(undefined8 *)&pSVar7->token = *(undefined8 *)local_348;
        (pSVar7->token).begin = sVar3;
        (pSVar7->token).end = *(size_t *)((long)local_348 + 0x10);
        (pSVar7->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (parser->instream).
                 super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var2 = (parser->instream).
                 super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
        (pSVar7->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var2;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        (pSVar7->parent_).super_OptionalBase<std::weak_ptr<SyntaxTree>_>.storage_.dummy_ = '\0';
        (pSVar7->udata).vtable = (vtable_type *)0x0;
        (pSVar7->childs).
        super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pSVar7->childs).
        super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)
         ((long)&(pSVar7->childs).
                 super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(pSVar7->childs).
                 super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
                  ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)&local_2b8._tail,pSVar7);
        _Stack_340.
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        .
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
        .
        super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
        .field_0._8_8_ = local_2b8._8_8_;
        _Stack_340.
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        .
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
        .
        super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
        .field_0._0_8_ = local_2b8._0_8_;
        local_348 = (undefined1  [8])((long)local_348 + 0x18);
        local_2b8._0_8_ = 0;
        local_2b8._8_8_ = 0;
        _Stack_340.
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        .
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
        ._which = 1;
      }
      auVar8 = local_348;
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::operator=((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                   *)&local_258._tail,&_Stack_340);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::_destroy(&_Stack_340);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&local_e0,
                 (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&local_258._tail);
      giveup_to_expected((ParserState *)local_348,&local_e0,"integer");
      add_error((ParserState *)&local_198._tail,(ParserState *)local_348);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                  *)local_348);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::_destroy(&local_e0._storage);
    }
    else {
      local_358 = (token_iterator)local_348;
      if ((local_348 == (undefined1  [8])end) || (*(int *)local_348 != 0x14)) {
        local_34c = GiveUp;
        make_error<ParserStatus,TokenStream::TokenData_const*&>
                  ((ParserState *)&local_2b8._tail,&local_34c,&local_358);
        local_348 = (undefined1  [8])end;
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        ::_storage(&_Stack_340.
                    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                   ,(_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                     *)&local_2b8._tail);
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
        ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                    *)&local_2b8._tail);
      }
      else {
        pSVar7 = (SyntaxTree *)operator_new(0x88);
        (pSVar7->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
        super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        (pSVar7->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
        super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pSVar7->type_ = Float;
        sVar3 = *(size_t *)((long)local_348 + 8);
        *(undefined8 *)&pSVar7->token = *(undefined8 *)local_348;
        (pSVar7->token).begin = sVar3;
        (pSVar7->token).end = *(size_t *)((long)local_348 + 0x10);
        (pSVar7->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (parser->instream).
                 super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var2 = (parser->instream).
                 super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
        (pSVar7->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var2;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        (pSVar7->parent_).super_OptionalBase<std::weak_ptr<SyntaxTree>_>.storage_.dummy_ = '\0';
        (pSVar7->udata).vtable = (vtable_type *)0x0;
        (pSVar7->childs).
        super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pSVar7->childs).
        super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)
         ((long)&(pSVar7->childs).
                 super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(pSVar7->childs).
                 super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
                  ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)&local_2b8._tail,pSVar7);
        _Stack_340.
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        .
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
        .
        super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
        .field_0._8_8_ = local_2b8._8_8_;
        _Stack_340.
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        .
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
        .
        super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
        .field_0._0_8_ = local_2b8._0_8_;
        local_348 = (undefined1  [8])((long)local_348 + 0x18);
        local_2b8._0_8_ = 0;
        local_2b8._8_8_ = 0;
        _Stack_340.
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        .
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
        ._which = 1;
      }
      auVar8 = local_348;
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::operator=((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                   *)&local_258._tail,&_Stack_340);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::_destroy(&_Stack_340);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&local_138,
                 (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&local_258._tail);
      giveup_to_expected((ParserState *)local_348,&local_138,"float");
      add_error((ParserState *)&local_198._tail,(ParserState *)local_348);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                  *)local_348);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::_destroy(&local_138._storage);
    }
    expect_newline((ParserState *)&local_198._tail,(token_iterator)auVar8,end);
    for (; auVar8 != (undefined1  [8])end; auVar8 = (undefined1  [8])&((SyntaxTree *)auVar8)->token)
    {
      if (*(Token *)&(((SyntaxTree *)auVar8)->super_enable_shared_from_this<SyntaxTree>).
                     _M_weak_this.super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          NewLine) {
        end = &((SyntaxTree *)auVar8)->token;
        break;
      }
    }
    bVar6 = eggs::variants::detail::
            apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                      ((anon_class_1_0_00000001 *)local_348,
                       (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                        *)&local_198._tail);
    if (bVar6) {
      pSVar7 = (SyntaxTree *)operator_new(0x88);
      (pSVar7->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
      super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (pSVar7->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
      super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pSVar7->type_ = local_350;
      uVar4 = *(undefined4 *)&local_360->field_0x4;
      sVar3 = local_360->begin;
      (pSVar7->token).type = local_360->type;
      *(undefined4 *)&(pSVar7->token).field_0x4 = uVar4;
      (pSVar7->token).begin = sVar3;
      (pSVar7->token).end = local_360->end;
      (pSVar7->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (parser->instream).
               super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (parser->instream).
               super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (pSVar7->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var2;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      (pSVar7->parent_).super_OptionalBase<std::weak_ptr<SyntaxTree>_>.storage_.dummy_ = '\0';
      (pSVar7->udata).vtable = (vtable_type *)0x0;
      (pSVar7->childs).
      super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pSVar7->childs).
      super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined8 *)
       ((long)&(pSVar7->childs).
               super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
      *(undefined8 *)
       ((long)&(pSVar7->childs).
               super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
      std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
                ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)local_348,pSVar7);
      auVar8 = local_348;
      pSVar7 = (SyntaxTree *)operator_new(0x88);
      (pSVar7->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
      super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (pSVar7->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
      super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pSVar7->type_ = Text;
      uVar4 = *(undefined4 *)&local_360->field_0x4;
      sVar3 = local_360->begin;
      (pSVar7->token).type = local_360->type;
      *(undefined4 *)&(pSVar7->token).field_0x4 = uVar4;
      (pSVar7->token).begin = sVar3;
      (pSVar7->token).end = local_360->end;
      (pSVar7->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (parser->instream).
               super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (parser->instream).
               super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (pSVar7->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var2;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      (pSVar7->parent_).super_OptionalBase<std::weak_ptr<SyntaxTree>_>.storage_.dummy_ = '\0';
      (pSVar7->udata).vtable = (vtable_type *)0x0;
      (pSVar7->childs).
      super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pSVar7->childs).
      super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined8 *)
       ((long)&(pSVar7->childs).
               super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
      *(undefined8 *)
       ((long)&(pSVar7->childs).
               super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
      std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
                ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)&local_2c8,pSVar7);
      SyntaxTree::add_child((SyntaxTree *)auVar8,&local_2c8);
      if (local_2c8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2c8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_1a8 != 1) {
LAB_0019d0ee:
        eggs::variants::detail::throw_bad_variant_access<ParserSuccess&>();
      }
      local_2d8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1f8._0_8_;
      local_2d8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_1f8._8_8_ + 8) = *(_Atomic_word *)(local_1f8._8_8_ + 8) + 1;
        }
      }
      SyntaxTree::add_child((SyntaxTree *)local_348,&local_2d8);
      if (local_2d8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2d8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_208 != 1) goto LAB_0019d0ee;
      local_2e8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_258._0_8_;
      local_2e8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_258._8_8_ + 8) = *(_Atomic_word *)(local_258._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_258._8_8_ + 8) = *(_Atomic_word *)(local_258._8_8_ + 8) + 1;
        }
      }
      SyntaxTree::add_child((SyntaxTree *)local_348,&local_2e8);
      if (local_2e8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2e8.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      uVar5 = _Stack_340.
              super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
              .
              super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
              .
              super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
              .field_0._0_8_;
      auVar8 = local_348;
      local_348 = (undefined1  [8])0x0;
      _Stack_340.
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      .
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
      .
      super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
      .field_0._0_8_ = 0;
      __return_storage_ptr__->first = end;
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->second)._storage.
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        .
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
        .
        super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
        .field_0 = auVar8;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->second)._storage.
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
               .
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
               .
               super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
               .field_0 + 8) = uVar5;
      (__return_storage_ptr__->second)._storage.
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      .
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
      ._which = 1;
    }
    else {
      __return_storage_ptr__->first = end;
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&__return_storage_ptr__->second,
                 (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&local_198._tail);
    }
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                *)&local_258._tail);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                *)&local_1f8._tail);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                *)&local_198._tail);
  }
  return __return_storage_ptr__;
}

Assistant:

static ParserResult parse_const_statement(ParserContext& parser, token_iterator begin, token_iterator end)
{
    if(begin != end
        && (begin->type == Token::CONST_INT || begin->type == Token::CONST_FLOAT))
    {
        ParserState state = ParserSuccess(nullptr);
        ParserState identifier, value;

        auto type = begin->type == Token::CONST_INT? NodeType::CONST_INT :
                    begin->type == Token::CONST_FLOAT? NodeType::CONST_FLOAT : Unreachable();

        auto it = std::next(begin);
        std::tie(it, identifier) = parse_identifier(parser, it, end);
        add_error(state, giveup_to_expected(identifier, "identifier"));

        if(type == NodeType::CONST_INT)
        {
            std::tie(it, value) = parse_integer(parser, it, end);
            add_error(state, giveup_to_expected(value, "integer"));
        }
        else if(type == NodeType::CONST_FLOAT)
        {
            std::tie(it, value) = parse_float(parser, it, end);
            add_error(state, giveup_to_expected(value, "float"));
        }

        expect_newline(state, it, end);
        it = parser_aftertoken(it, end, Token::NewLine);

        if(is<ParserSuccess>(state))
        {
            shared_ptr<SyntaxTree> tree(new SyntaxTree(type, parser.instream, *begin));
            tree->add_child(shared_ptr<SyntaxTree> { new SyntaxTree(NodeType::Text, parser.instream, *begin) });
            tree->add_child(get<ParserSuccess>(identifier).tree);
            tree->add_child(get<ParserSuccess>(value).tree);
            return std::make_pair(it, ParserSuccess(std::move(tree)));
        }
        else
        {
            return std::make_pair(it, std::move(state));
        }
    }
    return std::make_pair(end, make_error(ParserStatus::GiveUp, begin));
}